

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_column_writer.cpp
# Opt level: O0

idx_t duckdb::GetConsecutiveChildList(Vector *list,Vector *result,idx_t offset,idx_t count)

{
  bool bVar1;
  ulong uVar2;
  long in_RCX;
  ulong in_RDX;
  SelectionVector *in_RSI;
  idx_t k;
  idx_t c_1;
  idx_t index;
  SelectionVector sel;
  idx_t c;
  idx_t total_length;
  bool is_consecutive;
  list_entry_t *list_entries;
  ValidityMask *validity;
  ulong in_stack_ffffffffffffff70;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffff78;
  SelectionVector *in_stack_ffffffffffffff80;
  idx_t in_stack_ffffffffffffff88;
  SelectionVector *in_stack_ffffffffffffff90;
  undefined1 local_68 [24];
  ulong local_50;
  uint64_t local_48;
  byte local_39;
  list_entry_t *local_38;
  ValidityMask *local_30;
  long local_28;
  ulong local_20;
  SelectionVector *local_18;
  uint64_t local_8;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_30 = FlatVector::Validity((Vector *)0x86af8e);
  local_38 = FlatVector::GetData<duckdb::list_entry_t>((Vector *)0x86afa0);
  local_39 = 1;
  local_48 = 0;
  for (local_50 = local_20; local_50 < local_20 + local_28; local_50 = local_50 + 1) {
    bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                      (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    if (bVar1) {
      if (local_38[local_50].offset != local_48) {
        local_39 = 0;
      }
      local_48 = local_38[local_50].length + local_48;
    }
  }
  if ((local_39 & 1) == 0) {
    SelectionVector::SelectionVector(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    for (uVar2 = local_20; uVar2 < local_20 + local_28; uVar2 = uVar2 + 1) {
      bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
      if (bVar1) {
        for (in_stack_ffffffffffffff70 = 0; in_stack_ffffffffffffff70 < local_38[uVar2].length;
            in_stack_ffffffffffffff70 = in_stack_ffffffffffffff70 + 1) {
          SelectionVector::set_index
                    (in_stack_ffffffffffffff80,(idx_t)in_stack_ffffffffffffff78,
                     in_stack_ffffffffffffff70);
        }
      }
    }
    duckdb::Vector::Slice(local_18,(ulong)local_68);
    duckdb::Vector::Flatten((ulong)local_18);
    local_8 = local_48;
    SelectionVector::~SelectionVector((SelectionVector *)0x86b18f);
  }
  else {
    local_8 = local_48;
  }
  return local_8;
}

Assistant:

idx_t GetConsecutiveChildList(Vector &list, Vector &result, idx_t offset, idx_t count) {
	// returns a consecutive child list that fully flattens and repeats all required elements
	auto &validity = FlatVector::Validity(list);
	auto list_entries = FlatVector::GetData<list_entry_t>(list);
	bool is_consecutive = true;
	idx_t total_length = 0;
	for (idx_t c = offset; c < offset + count; c++) {
		if (!validity.RowIsValid(c)) {
			continue;
		}
		if (list_entries[c].offset != total_length) {
			is_consecutive = false;
		}
		total_length += list_entries[c].length;
	}
	if (is_consecutive) {
		// already consecutive - leave it as-is
		return total_length;
	}
	SelectionVector sel(total_length);
	idx_t index = 0;
	for (idx_t c = offset; c < offset + count; c++) {
		if (!validity.RowIsValid(c)) {
			continue;
		}
		for (idx_t k = 0; k < list_entries[c].length; k++) {
			sel.set_index(index++, list_entries[c].offset + k);
		}
	}
	result.Slice(sel, total_length);
	result.Flatten(total_length);
	return total_length;
}